

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lzham_lzcomp_internal.cpp
# Opt level: O0

bool __thiscall lzham::lzcompressor::flush(lzcompressor *this,lzham_flush_t flush_type)

{
  byte bVar1;
  uint uVar2;
  uint in_ESI;
  void *in_RDI;
  state *unaff_retaddr;
  bool status;
  undefined3 in_stack_ffffffffffffffe8;
  uint uVar3;
  void *pBuf;
  undefined7 in_stack_fffffffffffffff8;
  undefined1 in_stack_ffffffffffffffff;
  bool bVar4;
  
  if ((*(byte *)((long)in_RDI + 0x3974) & 1) == 0) {
    uVar3 = CONCAT13(1,in_stack_ffffffffffffffe8);
    pBuf = in_RDI;
    uVar2 = vector<unsigned_char>::size((vector<unsigned_char> *)((long)in_RDI + 0x3938));
    if (uVar2 != 0) {
      vector<unsigned_char>::get_ptr((vector<unsigned_char> *)((long)in_RDI + 0x3938));
      vector<unsigned_char>::size((vector<unsigned_char> *)((long)in_RDI + 0x3938));
      bVar4 = compress_block((lzcompressor *)
                             CONCAT17(in_stack_ffffffffffffffff,in_stack_fffffffffffffff8),pBuf,
                             in_ESI);
      uVar3 = CONCAT13(bVar4,(int3)uVar3);
      vector<unsigned_char>::try_resize
                ((vector<unsigned_char> *)CONCAT44(in_ESI,uVar3),(uint)((ulong)in_RDI >> 0x20),
                 SUB81((ulong)in_RDI >> 0x18,0));
    }
    bVar1 = (byte)(uVar3 >> 0x18);
    if (((uVar3 & 0x1000000) != 0) &&
       (bVar1 = send_sync_block((lzcompressor *)
                                CONCAT17(in_stack_ffffffffffffffff,in_stack_fffffffffffffff8),
                                (lzham_flush_t)((ulong)pBuf >> 0x20)), in_ESI == 3)) {
      search_accelerator::flush((search_accelerator *)((long)in_RDI + 0x78));
      state::reset(unaff_retaddr);
    }
    lzham_flush_buffered_printf();
    bVar4 = (bool)(bVar1 & 1);
  }
  else {
    bVar4 = false;
  }
  return bVar4;
}

Assistant:

bool lzcompressor::flush(lzham_flush_t flush_type)
   {
      LZHAM_ASSERT(!m_finished);
      if (m_finished)
      {
         LZHAM_LOG_ERROR(7023);
         return false;
      }

      bool status = true;
      if (m_block_buf.size())
      {
         status = compress_block(m_block_buf.get_ptr(), m_block_buf.size());

         m_block_buf.try_resize(0);
      }

      if (status)
      {
         status = send_sync_block(flush_type);

         if (LZHAM_FULL_FLUSH == flush_type)
         {
            m_accel.flush();
            m_state.reset();
         }
      }

      lzham_flush_buffered_printf();

      return status;
   }